

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_strings.hpp
# Opt level: O1

Elf_Word __thiscall
ELFIO::string_section_accessor::add_string(string_section_accessor *this,char *str)

{
  section *psVar1;
  Elf_Word EVar2;
  size_t sVar3;
  char empty_string;
  undefined1 local_19;
  
  if (this->string_section == (section *)0x0) {
    EVar2 = 0;
  }
  else {
    EVar2 = (*this->string_section->_vptr_section[0x13])();
    if (EVar2 == 0) {
      local_19 = 0;
      EVar2 = 1;
      (*this->string_section->_vptr_section[0x1a])(this->string_section,&local_19,1);
    }
    psVar1 = this->string_section;
    sVar3 = strlen(str);
    (*psVar1->_vptr_section[0x1a])(psVar1,str,(ulong)((int)sVar3 + 1));
  }
  return EVar2;
}

Assistant:

Elf_Word
    add_string( const char* str )
    {
        Elf_Word current_position = 0;
        
        if (string_section) {
            // Strings are addeded to the end of the current section data
            current_position = (Elf_Word)string_section->get_size();

            if ( current_position == 0 ) {
                char empty_string = '\0';
                string_section->append_data( &empty_string, 1 );
                current_position++;
            }
            string_section->append_data( str, (Elf_Word)std::strlen( str ) + 1 );
        }

        return current_position;
    }